

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::elasticityFilter
          (Highs *this,double global_lower_penalty,double global_upper_penalty,
          double global_rhs_penalty,double *param_4,double *param_5,double *param_6,
          bool get_infeasible_row,vector<int,_std::allocator<int>_> *infeasible_row_subset)

{
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  pointer *ppHVar1;
  vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *this_00;
  double *pdVar2;
  double dVar3;
  int original_num_col;
  int iVar4;
  int iVar5;
  pointer pbVar6;
  pointer pbVar7;
  pointer pcVar8;
  iterator iVar9;
  iterator __position;
  uint uVar10;
  undefined4 uVar11;
  HighsStatus return_status;
  long *plVar12;
  undefined8 *puVar13;
  pointer pHVar14;
  ulong uVar15;
  pointer piVar16;
  pointer __nbytes;
  ulong uVar17;
  long *plVar18;
  vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *__nbytes_00;
  pointer piVar19;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar20;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  void *__buf;
  void *extraout_RDX_12;
  void *extraout_RDX_13;
  void *pvVar21;
  void *__buf_00;
  void *extraout_RDX_14;
  void *extraout_RDX_15;
  HighsInt HVar22;
  int iVar23;
  uint uVar24;
  void *pvVar25;
  uint uVar26;
  long lVar27;
  pointer pbVar28;
  size_t sVar29;
  size_type __n;
  uint uVar30;
  int iVar31;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  uint local_4b0;
  byte local_4aa;
  byte local_4a9;
  vector<HighsVarType,_std::allocator<HighsVarType>_> all_continuous;
  HighsInt evar_ix;
  int local_480;
  byte local_479;
  double upper;
  long *local_470;
  long local_468;
  long local_460;
  long lStack_458;
  long *local_450;
  long local_448;
  long local_440;
  long lStack_438;
  long *local_430;
  long local_428;
  long local_420;
  long lStack_418;
  HighsTimer *local_410;
  string __str;
  vector<double,_std::allocator<double>_> col_upper;
  vector<double,_std::allocator<double>_> ecol_cost;
  vector<double,_std::allocator<double>_> col_lower;
  double upper_penalty;
  vector<int,_std::allocator<int>_> col_of_ecol;
  double lower_penalty;
  double lower;
  iterator iStack_340;
  double *local_338;
  vector<int,_std::allocator<int>_> row_of_ecol;
  vector<int,_std::allocator<int>_> erow_index;
  vector<HighsVarType,_std::allocator<HighsVarType>_> original_integrality;
  vector<double,_std::allocator<double>_> erow_value;
  vector<int,_std::allocator<int>_> erow_start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ecol_name;
  vector<double,_std::allocator<double>_> bound_of_col_of_ecol;
  vector<double,_std::allocator<double>_> bound_of_row_of_ecol;
  vector<double,_std::allocator<double>_> erow_upper;
  vector<double,_std::allocator<double>_> erow_lower;
  vector<double,_std::allocator<double>_> ecol_upper;
  vector<double,_std::allocator<double>_> ecol_lower;
  vector<double,_std::allocator<double>_> original_col_upper;
  vector<double,_std::allocator<double>_> original_col_lower;
  vector<double,_std::allocator<double>_> original_col_cost;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  erow_name;
  vector<double,_std::allocator<double>_> zero_costs;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ecol_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ecol_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ecol_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  erow_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  erow_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  erow_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  original_num_col = (this->model_).lp_.num_col_;
  local_480 = (this->model_).lp_.num_row_;
  evar_ix = original_num_col;
  local_410 = (HighsTimer *)global_rhs_penalty;
  std::vector<double,_std::allocator<double>_>::vector
            (&original_col_cost,&(this->model_).lp_.col_cost_);
  __x = &(this->model_).lp_.col_lower_;
  std::vector<double,_std::allocator<double>_>::vector(&original_col_lower,__x);
  __x_00 = &(this->model_).lp_.col_upper_;
  std::vector<double,_std::allocator<double>_>::vector(&original_col_upper,__x_00);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            (&original_integrality,&(this->model_).lp_.integrality_);
  zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&zero_costs,(long)original_num_col,(value_type_conflict1 *)&all_continuous);
  changeColsCost(this,0,(this->model_).lp_.num_col_ + -1,
                 zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
  uVar20 = extraout_RDX;
  if ((get_infeasible_row) &&
     ((this->model_).lp_.integrality_.
      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->model_).lp_.integrality_.
      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_470 = (long *)((ulong)local_470 & 0xffffffffffffff00);
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_fill_assign
              (&all_continuous,(long)original_num_col,(value_type *)&local_470);
    changeColsIntegrality
              (this,0,(this->model_).lp_.num_col_ + -1,
               all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
               _M_impl.super__Vector_impl_data._M_start);
    uVar20 = extraout_RDX_00;
    if (all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      uVar20 = extraout_RDX_01;
    }
  }
  uVar24 = -(uint)(0.0 <= global_upper_penalty || 0.0 <= global_lower_penalty);
  __nbytes = (pointer)(ulong)uVar24;
  local_4a9 = (param_5 != (double *)0x0 || param_4 != (double *)0x0) | (byte)uVar24;
  pvVar21 = (void *)CONCAT71((int7)((ulong)uVar20 >> 8),local_4a9);
  local_479 = param_6 != (double *)0x0;
  local_4aa = 0.0 <= (double)local_410;
  iVar4 = (this->model_).lp_.num_col_;
  iVar23 = iVar4;
  if ((param_5 != (double *)0x0 || param_4 != (double *)0x0) || (uVar24 & 1) != 0) {
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pbVar6 = (this->model_).lp_.col_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (this->model_).lp_.col_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)all_continuous.
                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
    if (erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&erow_start,
                 (iterator)
                 erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&all_continuous);
    }
    else {
      *erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 0;
      erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_4b0 = 0;
    iVar23 = (this->model_).lp_.num_col_;
    if (0 < iVar23) {
      do {
        lower = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)local_4b0];
        upper = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)local_4b0];
        if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&col_lower,
                     (iterator)
                     col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&lower);
        }
        else {
          *col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = lower;
          col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&col_upper,
                     (iterator)
                     col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&upper);
        }
        else {
          *col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = upper;
          col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if ((-INFINITY < lower) || (upper < INFINITY)) {
          lower_penalty = global_lower_penalty;
          if (param_4 != (double *)0x0) {
            lower_penalty = param_4[(int)local_4b0];
          }
          if ((0.0 <= lower_penalty) || (upper < INFINITY)) {
            upper_penalty = global_upper_penalty;
            if (param_5 != (double *)0x0) {
              upper_penalty = param_5[(int)local_4b0];
            }
            if ((-INFINITY < lower) || (0.0 <= upper_penalty)) {
              if (erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&erow_lower,
                           (iterator)
                           erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,&lower);
              }
              else {
                *erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish = lower;
                erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&erow_upper,
                           (iterator)
                           erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,&upper);
              }
              else {
                *erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish = upper;
                erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (pbVar7 != pbVar6) {
                uVar24 = -local_4b0;
                if (0 < (int)local_4b0) {
                  uVar24 = local_4b0;
                }
                uVar30 = 1;
                if (9 < uVar24) {
                  uVar17 = (ulong)uVar24;
                  uVar26 = 4;
                  do {
                    uVar30 = uVar26;
                    uVar10 = (uint)uVar17;
                    if (uVar10 < 100) {
                      uVar30 = uVar30 - 2;
                      goto LAB_00230ec0;
                    }
                    if (uVar10 < 1000) {
                      uVar30 = uVar30 - 1;
                      goto LAB_00230ec0;
                    }
                    if (uVar10 < 10000) goto LAB_00230ec0;
                    uVar17 = uVar17 / 10000;
                    uVar26 = uVar30 + 4;
                  } while (99999 < uVar10);
                  uVar30 = uVar30 + 1;
                }
LAB_00230ec0:
                uVar26 = local_4b0 >> 0x1f;
                __str._M_dataplus._M_p = (pointer)&__str.field_2;
                std::__cxx11::string::_M_construct
                          ((ulong)&__str,(char)uVar30 - (char)((int)local_4b0 >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (__str._M_dataplus._M_p + uVar26,uVar30,uVar24);
                plVar12 = (long *)std::__cxx11::string::replace
                                            ((ulong)&__str,0,(char *)0x0,0x3c8489);
                local_450 = &local_440;
                plVar18 = plVar12 + 2;
                if ((long *)*plVar12 == plVar18) {
                  local_440 = *plVar18;
                  lStack_438 = plVar12[3];
                }
                else {
                  local_440 = *plVar18;
                  local_450 = (long *)*plVar12;
                }
                local_448 = plVar12[1];
                *plVar12 = (long)plVar18;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                plVar12 = (long *)std::__cxx11::string::append((char *)&local_450);
                local_430 = &local_420;
                plVar18 = plVar12 + 2;
                if ((long *)*plVar12 == plVar18) {
                  local_420 = *plVar18;
                  lStack_418 = plVar12[3];
                }
                else {
                  local_420 = *plVar18;
                  local_430 = (long *)*plVar12;
                }
                local_428 = plVar12[1];
                *plVar12 = (long)plVar18;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                plVar12 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_430,
                                             (ulong)(this->model_).lp_.col_names_.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)local_4b0]._M_dataplus._M_p);
                local_470 = &local_460;
                plVar18 = plVar12 + 2;
                if ((long *)*plVar12 == plVar18) {
                  local_460 = *plVar18;
                  lStack_458 = plVar12[3];
                }
                else {
                  local_460 = *plVar18;
                  local_470 = (long *)*plVar12;
                }
                local_468 = plVar12[1];
                *plVar12 = (long)plVar18;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)&all_continuous.
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                pHVar14 = (pointer)(plVar12 + 2);
                if ((pointer)*plVar12 == pHVar14) {
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
                }
                else {
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar12;
                }
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar12[1];
                *plVar12 = (long)pHVar14;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &erow_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &all_continuous);
                if ((pointer *)
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    &all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  operator_delete(all_continuous.
                                  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_470 != &local_460) {
                  operator_delete(local_470);
                }
                if (local_430 != &local_420) {
                  operator_delete(local_430);
                }
                if (local_450 != &local_440) {
                  operator_delete(local_450);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != &__str.field_2) {
                  operator_delete(__str._M_dataplus._M_p);
                }
              }
              if (erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&erow_index,
                           (iterator)
                           erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_4b0);
              }
              else {
                *erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_4b0;
                erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
              if (erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (&erow_value,
                           (iterator)
                           erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(double *)&all_continuous);
              }
              else {
                *erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish = 1.0;
                erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if ((lower != -INFINITY) && (0.0 <= lower_penalty)) {
                if (col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&col_of_ecol,
                             (iterator)
                             col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)&local_4b0);
                }
                else {
                  *col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_4b0;
                  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if (pbVar7 != pbVar6) {
                  uVar24 = -local_4b0;
                  if (0 < (int)local_4b0) {
                    uVar24 = local_4b0;
                  }
                  uVar30 = 1;
                  if (9 < uVar24) {
                    uVar17 = (ulong)uVar24;
                    uVar26 = 4;
                    do {
                      uVar30 = uVar26;
                      uVar10 = (uint)uVar17;
                      if (uVar10 < 100) {
                        uVar30 = uVar30 - 2;
                        goto LAB_0023128f;
                      }
                      if (uVar10 < 1000) {
                        uVar30 = uVar30 - 1;
                        goto LAB_0023128f;
                      }
                      if (uVar10 < 10000) goto LAB_0023128f;
                      uVar17 = uVar17 / 10000;
                      uVar26 = uVar30 + 4;
                    } while (99999 < uVar10);
                    uVar30 = uVar30 + 1;
                  }
LAB_0023128f:
                  uVar26 = local_4b0 >> 0x1f;
                  __str._M_dataplus._M_p = (pointer)&__str.field_2;
                  std::__cxx11::string::_M_construct
                            ((ulong)&__str,(char)uVar30 - (char)((int)local_4b0 >> 0x1f));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (__str._M_dataplus._M_p + uVar26,uVar30,uVar24);
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3c8494);
                  local_450 = &local_440;
                  plVar12 = puVar13 + 2;
                  if ((long *)*puVar13 == plVar12) {
                    local_440 = *plVar12;
                    lStack_438 = puVar13[3];
                  }
                  else {
                    local_440 = *plVar12;
                    local_450 = (long *)*puVar13;
                  }
                  local_448 = puVar13[1];
                  *puVar13 = plVar12;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                  local_430 = &local_420;
                  plVar12 = puVar13 + 2;
                  if ((long *)*puVar13 == plVar12) {
                    local_420 = *plVar12;
                    lStack_418 = puVar13[3];
                  }
                  else {
                    local_420 = *plVar12;
                    local_430 = (long *)*puVar13;
                  }
                  local_428 = puVar13[1];
                  *puVar13 = plVar12;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_430,
                                       (ulong)(this->model_).lp_.col_names_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(int)local_4b0]._M_dataplus._M_p);
                  local_470 = &local_460;
                  plVar12 = puVar13 + 2;
                  if ((long *)*puVar13 == plVar12) {
                    local_460 = *plVar12;
                    lStack_458 = puVar13[3];
                  }
                  else {
                    local_460 = *plVar12;
                    local_470 = (long *)*puVar13;
                  }
                  local_468 = puVar13[1];
                  *puVar13 = plVar12;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)&all_continuous.
                                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pHVar14 = (pointer)(plVar12 + 2);
                  if ((pointer)*plVar12 == pHVar14) {
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
                  }
                  else {
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar12;
                  }
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar12[1];
                  *plVar12 = (long)pHVar14;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &ecol_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &all_continuous);
                  if ((pointer *)
                      all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      &all_continuous.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(all_continuous.
                                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_470 != &local_460) {
                    operator_delete(local_470);
                  }
                  if (local_430 != &local_420) {
                    operator_delete(local_430);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)__str._M_dataplus._M_p != &__str.field_2) {
                    operator_delete(__str._M_dataplus._M_p);
                  }
                }
                if (bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_finish ==
                    bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&bound_of_col_of_ecol,
                             (iterator)
                             bound_of_col_of_ecol.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,&lower);
                }
                else {
                  *bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = lower;
                  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(int)local_4b0] = -INFINITY;
                if (erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&erow_index,
                             (iterator)
                             erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&evar_ix);
                }
                else {
                  *erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = evar_ix;
                  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
                if (erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (&erow_value,
                             (iterator)
                             erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(double *)&all_continuous);
                }
                else {
                  *erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = 1.0;
                  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&ecol_cost,
                             (iterator)
                             ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,&lower_penalty);
                }
                else {
                  *ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = lower_penalty;
                  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                evar_ix = evar_ix + 1;
              }
              if ((upper != INFINITY) && (0.0 <= upper_penalty)) {
                if (col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&col_of_ecol,
                             (iterator)
                             col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)&local_4b0);
                }
                else {
                  *col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_4b0;
                  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if (pbVar7 != pbVar6) {
                  uVar24 = -local_4b0;
                  if (0 < (int)local_4b0) {
                    uVar24 = local_4b0;
                  }
                  uVar30 = 1;
                  if (9 < uVar24) {
                    uVar17 = (ulong)uVar24;
                    uVar26 = 4;
                    do {
                      uVar30 = uVar26;
                      uVar10 = (uint)uVar17;
                      if (uVar10 < 100) {
                        uVar30 = uVar30 - 2;
                        goto LAB_002316fe;
                      }
                      if (uVar10 < 1000) {
                        uVar30 = uVar30 - 1;
                        goto LAB_002316fe;
                      }
                      if (uVar10 < 10000) goto LAB_002316fe;
                      uVar17 = uVar17 / 10000;
                      uVar26 = uVar30 + 4;
                    } while (99999 < uVar10);
                    uVar30 = uVar30 + 1;
                  }
LAB_002316fe:
                  uVar26 = local_4b0 >> 0x1f;
                  __str._M_dataplus._M_p = (pointer)&__str.field_2;
                  std::__cxx11::string::_M_construct
                            ((ulong)&__str,(char)uVar30 - (char)((int)local_4b0 >> 0x1f));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (__str._M_dataplus._M_p + uVar26,uVar30,uVar24);
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3c8494);
                  local_450 = &local_440;
                  plVar12 = puVar13 + 2;
                  if ((long *)*puVar13 == plVar12) {
                    local_440 = *plVar12;
                    lStack_438 = puVar13[3];
                  }
                  else {
                    local_440 = *plVar12;
                    local_450 = (long *)*puVar13;
                  }
                  local_448 = puVar13[1];
                  *puVar13 = plVar12;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                  local_430 = &local_420;
                  plVar12 = puVar13 + 2;
                  if ((long *)*puVar13 == plVar12) {
                    local_420 = *plVar12;
                    lStack_418 = puVar13[3];
                  }
                  else {
                    local_420 = *plVar12;
                    local_430 = (long *)*puVar13;
                  }
                  local_428 = puVar13[1];
                  *puVar13 = plVar12;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_430,
                                       (ulong)(this->model_).lp_.col_names_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(int)local_4b0]._M_dataplus._M_p);
                  local_470 = &local_460;
                  plVar12 = puVar13 + 2;
                  if ((long *)*puVar13 == plVar12) {
                    local_460 = *plVar12;
                    lStack_458 = puVar13[3];
                  }
                  else {
                    local_460 = *plVar12;
                    local_470 = (long *)*puVar13;
                  }
                  local_468 = puVar13[1];
                  *puVar13 = plVar12;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)&all_continuous.
                                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pHVar14 = (pointer)(plVar12 + 2);
                  if ((pointer)*plVar12 == pHVar14) {
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
                  }
                  else {
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar12;
                  }
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar12[1];
                  *plVar12 = (long)pHVar14;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &ecol_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &all_continuous);
                  if ((pointer *)
                      all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      &all_continuous.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(all_continuous.
                                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_470 != &local_460) {
                    operator_delete(local_470);
                  }
                  if (local_430 != &local_420) {
                    operator_delete(local_430);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)__str._M_dataplus._M_p != &__str.field_2) {
                    operator_delete(__str._M_dataplus._M_p);
                  }
                }
                if (bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_finish ==
                    bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&bound_of_col_of_ecol,
                             (iterator)
                             bound_of_col_of_ecol.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,&upper);
                }
                else {
                  *bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = upper;
                  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(int)local_4b0] = INFINITY;
                if (erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&erow_index,
                             (iterator)
                             erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&evar_ix);
                }
                else {
                  *erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = evar_ix;
                  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
                if (erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (&erow_value,
                             (iterator)
                             erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(double *)&all_continuous);
                }
                else {
                  *erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = -1.0;
                  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&ecol_cost,
                             (iterator)
                             ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,&upper_penalty);
                }
                else {
                  *ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = upper_penalty;
                  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                evar_ix = evar_ix + 1;
              }
              iVar23 = (int)((ulong)((long)erow_index.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)erow_index.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2);
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(all_continuous.
                                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar23);
              if (erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&erow_start,
                           (iterator)
                           erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&all_continuous);
              }
              else {
                *erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar23;
                erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
          }
        }
        local_4b0 = local_4b0 + 1;
        iVar23 = (this->model_).lp_.num_col_;
      } while ((int)local_4b0 < iVar23);
    }
    uVar17 = (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar30 = (int)((ulong)((long)erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) - 1;
    HVar22 = erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)uVar30];
    changeColsBounds(this,0,iVar23 + -1,
                     col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
    uVar24 = (uint)(uVar17 >> 2);
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_lower,(long)(int)uVar24,(value_type_conflict1 *)&all_continuous);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_upper,(long)(int)uVar24,(value_type_conflict1 *)&kHighsInf);
    addCols(this,uVar24,
            ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,0,(HighsInt *)0x0,(HighsInt *)0x0,(double *)0x0);
    __nbytes = erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    addRows(this,uVar30,
            erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,HVar22,
            erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start,
            erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start,
            erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start);
    pvVar21 = extraout_RDX_02;
    if (pbVar7 != pbVar6) {
      if (0 < (int)uVar24) {
        uVar17 = (ulong)(uVar24 & 0x7fffffff);
        lVar27 = 0;
        HVar22 = iVar4;
        do {
          passColName(this,HVar22,
                      (string *)
                      ((long)&((ecol_name.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar27));
          HVar22 = HVar22 + 1;
          lVar27 = lVar27 + 0x20;
          uVar17 = uVar17 - 1;
          pvVar21 = extraout_RDX_03;
        } while (uVar17 != 0);
      }
      if (0 < (int)uVar30) {
        lVar27 = 0;
        iVar23 = local_480;
        do {
          passRowName(this,iVar23,
                      (string *)
                      ((long)&((erow_name.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar27));
          iVar23 = iVar23 + 1;
          lVar27 = lVar27 + 0x20;
          pvVar21 = extraout_RDX_04;
        } while ((ulong)uVar30 << 5 != lVar27);
      }
    }
    if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar21 = extraout_RDX_05;
    }
    if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar21 = extraout_RDX_06;
    }
    iVar23 = (this->model_).lp_.num_col_;
  }
  pbVar7 = ecol_name.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar6 = ecol_name.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_4aa = local_4aa | local_479;
  if (local_4aa != 0) {
    pbVar28 = ecol_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ecol_name.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        ecol_name.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pcVar8 = (pbVar28->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar8 != &pbVar28->field_2) {
          operator_delete(pcVar8);
        }
        pbVar28 = pbVar28 + 1;
      } while (pbVar28 != pbVar7);
      ecol_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
    }
    if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_338 = (double *)0x0;
    lower = 0.0;
    iStack_340._M_current = (double *)0x0;
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)all_continuous.
                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)&col_lower,(iterator)0x0,(int *)&all_continuous)
    ;
    pbVar6 = (this->model_).lp_.row_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (this->model_).lp_.row_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_4b0 = 0;
    if (0 < local_480) {
      do {
        lVar27 = (long)(int)local_4b0;
        upper = (double)local_410;
        if (param_6 != (double *)0x0) {
          upper = param_6[lVar27];
        }
        if (0.0 <= upper) {
          lower_penalty =
               (this->model_).lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar27];
          upper_penalty =
               (this->model_).lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar27];
          if (lower_penalty != -INFINITY) {
            if (row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&row_of_ecol,
                         (iterator)
                         row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_4b0);
            }
            else {
              *row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_4b0;
              row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (pbVar7 != pbVar6) {
              uVar24 = -local_4b0;
              if (0 < (int)local_4b0) {
                uVar24 = local_4b0;
              }
              uVar30 = 1;
              if (9 < uVar24) {
                uVar17 = (ulong)uVar24;
                uVar26 = 4;
                do {
                  uVar30 = uVar26;
                  uVar10 = (uint)uVar17;
                  if (uVar10 < 100) {
                    uVar30 = uVar30 - 2;
                    goto LAB_00231ea7;
                  }
                  if (uVar10 < 1000) {
                    uVar30 = uVar30 - 1;
                    goto LAB_00231ea7;
                  }
                  if (uVar10 < 10000) goto LAB_00231ea7;
                  uVar17 = uVar17 / 10000;
                  uVar26 = uVar30 + 4;
                } while (99999 < uVar10);
                uVar30 = uVar30 + 1;
              }
LAB_00231ea7:
              uVar26 = local_4b0 >> 0x1f;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar30 - (char)((int)local_4b0 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (__str._M_dataplus._M_p + uVar26,uVar30,uVar24);
              puVar13 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3c8489);
              plVar12 = puVar13 + 2;
              if ((long *)*puVar13 == plVar12) {
                local_440 = *plVar12;
                lStack_438 = puVar13[3];
                local_450 = &local_440;
              }
              else {
                local_440 = *plVar12;
                local_450 = (long *)*puVar13;
              }
              local_448 = puVar13[1];
              *puVar13 = plVar12;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
              plVar12 = puVar13 + 2;
              if ((long *)*puVar13 == plVar12) {
                local_420 = *plVar12;
                lStack_418 = puVar13[3];
                local_430 = &local_420;
              }
              else {
                local_420 = *plVar12;
                local_430 = (long *)*puVar13;
              }
              local_428 = puVar13[1];
              *puVar13 = plVar12;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              puVar13 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_430,
                                   (ulong)(this->model_).lp_.row_names_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(int)local_4b0].
                                          _M_dataplus._M_p);
              plVar12 = puVar13 + 2;
              if ((long *)*puVar13 == plVar12) {
                local_460 = *plVar12;
                lStack_458 = puVar13[3];
                local_470 = &local_460;
              }
              else {
                local_460 = *plVar12;
                local_470 = (long *)*puVar13;
              }
              local_468 = puVar13[1];
              *puVar13 = plVar12;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&all_continuous.
                             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              pHVar14 = (pointer)(plVar12 + 2);
              if ((pointer)*plVar12 == pHVar14) {
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
              }
              else {
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar12;
              }
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar12[1];
              *plVar12 = (long)pHVar14;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &ecol_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &all_continuous);
              if ((pointer *)
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  &all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(all_continuous.
                                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_470 != &local_460) {
                operator_delete(local_470);
              }
              if (local_430 != &local_420) {
                operator_delete(local_430);
              }
              if (local_450 != &local_440) {
                operator_delete(local_450);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p);
              }
            }
            if (bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&bound_of_row_of_ecol,
                         (iterator)
                         bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&lower_penalty);
            }
            else {
              *bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = lower_penalty;
              bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&col_upper,
                         (iterator)
                         col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_4b0);
            }
            else {
              *(uint *)col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_4b0;
              col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4);
            }
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
            if (iStack_340._M_current == local_338) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        ((vector<double,_std::allocator<double>_> *)&lower,iStack_340,
                         (double *)&all_continuous);
            }
            else {
              *iStack_340._M_current = 1.0;
              iStack_340._M_current = iStack_340._M_current + 1;
            }
            uVar11 = (undefined4)
                     ((ulong)((long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(all_continuous.
                                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,uVar11);
            if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&col_lower,
                         (iterator)
                         col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&all_continuous);
            }
            else {
              *(undefined4 *)
               col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar11;
              col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4);
            }
            if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&ecol_cost,
                         (iterator)
                         ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,&upper);
            }
            else {
              *ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = upper;
              ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            evar_ix = evar_ix + 1;
          }
          if (upper_penalty != INFINITY) {
            if (row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&row_of_ecol,
                         (iterator)
                         row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_4b0);
            }
            else {
              *row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_4b0;
              row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (pbVar7 != pbVar6) {
              uVar24 = -local_4b0;
              if (0 < (int)local_4b0) {
                uVar24 = local_4b0;
              }
              uVar30 = 1;
              if (9 < uVar24) {
                uVar17 = (ulong)uVar24;
                uVar26 = 4;
                do {
                  uVar30 = uVar26;
                  uVar10 = (uint)uVar17;
                  if (uVar10 < 100) {
                    uVar30 = uVar30 - 2;
                    goto LAB_00232306;
                  }
                  if (uVar10 < 1000) {
                    uVar30 = uVar30 - 1;
                    goto LAB_00232306;
                  }
                  if (uVar10 < 10000) goto LAB_00232306;
                  uVar17 = uVar17 / 10000;
                  uVar26 = uVar30 + 4;
                } while (99999 < uVar10);
                uVar30 = uVar30 + 1;
              }
LAB_00232306:
              uVar26 = local_4b0 >> 0x1f;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar30 - (char)((int)local_4b0 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (__str._M_dataplus._M_p + uVar26,uVar30,uVar24);
              puVar13 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3c8489);
              plVar12 = puVar13 + 2;
              if ((long *)*puVar13 == plVar12) {
                local_440 = *plVar12;
                lStack_438 = puVar13[3];
                local_450 = &local_440;
              }
              else {
                local_440 = *plVar12;
                local_450 = (long *)*puVar13;
              }
              local_448 = puVar13[1];
              *puVar13 = plVar12;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
              plVar12 = puVar13 + 2;
              if ((long *)*puVar13 == plVar12) {
                local_420 = *plVar12;
                lStack_418 = puVar13[3];
                local_430 = &local_420;
              }
              else {
                local_420 = *plVar12;
                local_430 = (long *)*puVar13;
              }
              local_428 = puVar13[1];
              *puVar13 = plVar12;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              puVar13 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_430,
                                   (ulong)(this->model_).lp_.row_names_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(int)local_4b0].
                                          _M_dataplus._M_p);
              plVar12 = puVar13 + 2;
              if ((long *)*puVar13 == plVar12) {
                local_460 = *plVar12;
                lStack_458 = puVar13[3];
                local_470 = &local_460;
              }
              else {
                local_460 = *plVar12;
                local_470 = (long *)*puVar13;
              }
              local_468 = puVar13[1];
              *puVar13 = plVar12;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&all_continuous.
                             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              pHVar14 = (pointer)(plVar12 + 2);
              if ((pointer)*plVar12 == pHVar14) {
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
              }
              else {
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar14;
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar12;
              }
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar12[1];
              *plVar12 = (long)pHVar14;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &ecol_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &all_continuous);
              if ((pointer *)
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  &all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(all_continuous.
                                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_470 != &local_460) {
                operator_delete(local_470);
              }
              if (local_430 != &local_420) {
                operator_delete(local_430);
              }
              if (local_450 != &local_440) {
                operator_delete(local_450);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p);
              }
            }
            if (bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&bound_of_row_of_ecol,
                         (iterator)
                         bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&upper_penalty);
            }
            else {
              *bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = upper_penalty;
              bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&col_upper,
                         (iterator)
                         col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_4b0);
            }
            else {
              *(uint *)col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_4b0;
              col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4);
            }
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
            if (iStack_340._M_current == local_338) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        ((vector<double,_std::allocator<double>_> *)&lower,iStack_340,
                         (double *)&all_continuous);
            }
            else {
              *iStack_340._M_current = -1.0;
              iStack_340._M_current = iStack_340._M_current + 1;
            }
            uVar11 = (undefined4)
                     ((ulong)((long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(all_continuous.
                                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,uVar11);
            if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&col_lower,
                         (iterator)
                         col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&all_continuous);
            }
            else {
              *(undefined4 *)
               col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar11;
              col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4);
            }
            if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&ecol_cost,
                         (iterator)
                         ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,&upper);
            }
            else {
              *ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = upper;
              ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            evar_ix = evar_ix + 1;
          }
        }
        local_4b0 = local_4b0 + 1;
      } while ((int)local_4b0 < local_480);
    }
    iVar31 = (int)((ulong)((long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
    __n = (size_type)iVar31;
    HVar22 = *(HighsInt *)
              ((long)col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + __n * 4);
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_lower,__n,(value_type_conflict1 *)&all_continuous);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_upper,__n,(value_type_conflict1 *)&kHighsInf);
    __nbytes = ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    addCols(this,iVar31,
            ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,HVar22,
            (HighsInt *)
            col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            (HighsInt *)
            col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,(double *)lower);
    pvVar21 = extraout_RDX_07;
    if ((pbVar7 != pbVar6) && (0 < iVar31)) {
      lVar27 = 0;
      iVar31 = iVar23;
      do {
        passColName(this,iVar31,
                    (string *)
                    ((long)&((ecol_name.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar27
                    ));
        iVar31 = iVar31 + 1;
        lVar27 = lVar27 + 0x20;
        pvVar21 = extraout_RDX_08;
      } while (__n * 0x20 != lVar27);
    }
    if (lower != 0.0) {
      operator_delete((void *)lower);
      pvVar21 = extraout_RDX_09;
    }
    if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar21 = extraout_RDX_10;
    }
    if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar21 = extraout_RDX_11;
    }
  }
  local_410 = &this->timer_;
  HighsTimer::read(local_410,0,pvVar21,(size_t)__nbytes);
  iVar31 = (this->info_).super_HighsInfoStruct.simplex_iteration_count;
  return_status = run(this);
  if (return_status == kOk) {
    HighsTimer::read(local_410,0,__buf,(size_t)__nbytes);
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(extraout_XMM0_Qa_00 - extraout_XMM0_Qa);
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(all_continuous.
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,
                           (this->info_).super_HighsInfoStruct.simplex_iteration_count - iVar31);
    iVar9._M_current =
         (this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::_M_realloc_insert<HighsIisInfo_const&>
                ((vector<HighsIisInfo,std::allocator<HighsIisInfo>> *)&(this->iis_).info_,iVar9,
                 (HighsIisInfo *)&all_continuous);
      pvVar21 = extraout_RDX_13;
    }
    else {
      (iVar9._M_current)->simplex_time =
           (double)all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)&(iVar9._M_current)->simplex_iterations =
           all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_finish;
      ppHVar1 = &(this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
      pvVar21 = extraout_RDX_12;
    }
    if (get_infeasible_row) {
      this_00 = &(this->iis_).info_;
      uVar17 = 0;
      __nbytes_00 = this_00;
      do {
        uVar15 = uVar17;
        iVar31 = 0;
        if (((local_4a9 & 1) != 0) &&
           (__nbytes_00 = (vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)
                          col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,
           col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish !=
           col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start)) {
          pvVar25 = (void *)0x0;
          iVar31 = 0;
          piVar16 = col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            dVar3 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)iVar4 + (long)pvVar25];
            pdVar2 = &(this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
            if (*pdVar2 <= dVar3 && dVar3 != *pdVar2) {
              changeColBounds(this,iVar4 + (int)pvVar25,0.0,0.0);
              iVar31 = iVar31 + 1;
              piVar16 = col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              __nbytes_00 = (vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)
                            col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
            }
            pvVar25 = (void *)((long)pvVar25 + 1);
            pvVar21 = (void *)((long)__nbytes_00 - (long)piVar16 >> 2);
          } while (pvVar25 < pvVar21);
        }
        if ((local_4aa != 0) &&
           (__nbytes_00 = (vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)
                          row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,
           row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish !=
           row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start)) {
          pvVar25 = (void *)0x0;
          piVar16 = row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            dVar3 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)iVar23 + (long)pvVar25];
            pdVar2 = &(this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
            if (*pdVar2 <= dVar3 && dVar3 != *pdVar2) {
              changeColBounds(this,iVar23 + (int)pvVar25,0.0,0.0);
              iVar31 = iVar31 + 1;
              piVar16 = row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              __nbytes_00 = (vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)
                            row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
            }
            pvVar25 = (void *)((long)pvVar25 + 1);
            pvVar21 = (void *)((long)__nbytes_00 - (long)piVar16 >> 2);
          } while (pvVar25 < pvVar21);
        }
        if (iVar31 == 0) break;
        HighsTimer::read(local_410,0,pvVar21,(size_t)__nbytes_00);
        iVar5 = (this->info_).super_HighsInfoStruct.simplex_iteration_count;
        return_status = run(this);
        if (return_status != kOk) {
          std::vector<double,_std::allocator<double>_>::vector(&local_a8,&original_col_upper);
          uVar17 = (long)original_integrality.
                         super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)original_integrality.
                         super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar17 == 0) {
            pHVar14 = (pointer)0x0;
            sVar29 = 0;
          }
          else {
            if ((long)uVar17 < 0) {
              std::__throw_bad_alloc();
            }
            pHVar14 = (pointer)operator_new(uVar17);
            sVar29 = (long)original_integrality.
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)original_integrality.
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                           super__Vector_impl_data._M_start;
          }
          local_c0.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pHVar14 + uVar17;
          local_c0.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start = pHVar14;
          if (original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            memmove(pHVar14,original_integrality.
                            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                            super__Vector_impl_data._M_start,sVar29);
          }
          local_c0.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_finish = pHVar14 + sVar29;
          elasticityFilterReturn
                    (this,return_status,false,original_num_col,local_480,&original_col_cost,
                     &original_col_lower,&local_a8,&local_c0);
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          if (pHVar14 != (pointer)0x0) {
            operator_delete(pHVar14);
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          goto LAB_00232eeb;
        }
        HighsTimer::read(local_410,0,__buf_00,(size_t)__nbytes_00);
        all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(extraout_XMM0_Qa_02 - extraout_XMM0_Qa_01);
        all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(all_continuous.
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               (this->info_).super_HighsInfoStruct.simplex_iteration_count - iVar5);
        iVar9._M_current =
             (this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::
          _M_realloc_insert<HighsIisInfo_const&>
                    ((vector<HighsIisInfo,std::allocator<HighsIisInfo>> *)this_00,iVar9,
                     (HighsIisInfo *)&all_continuous);
          pvVar21 = extraout_RDX_15;
        }
        else {
          (iVar9._M_current)->simplex_time =
               (double)all_continuous.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_start;
          *(pointer *)&(iVar9._M_current)->simplex_iterations =
               all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          ppHVar1 = &(this->iis_).info_.
                     super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppHVar1 = *ppHVar1 + 1;
          pvVar21 = extraout_RDX_14;
        }
        uVar17 = (ulong)((int)uVar15 + 1);
      } while (this->model_status_ != kInfeasible);
      piVar16 = (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar16) {
        (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = piVar16;
      }
      local_410 = (HighsTimer *)((ulong)local_410 & 0xffffffff00000000);
      uVar24 = 0;
      if (((local_4a9 & 1) != 0) &&
         (col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start)) {
        uVar17 = 0;
        uVar24 = 0;
        piVar16 = col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar19 = col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          dVar3 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar4 + uVar17];
          if ((dVar3 == 0.0) && (!NAN(dVar3))) {
            uVar24 = uVar24 + 1;
            printf("Col e-col %2d (column %2d) corresponds to column %2d with bound %g and is enforced\n"
                   ,bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar17],uVar17 & 0xffffffff,
                   (ulong)(uint)(iVar4 + (int)uVar17),(ulong)(uint)piVar16[uVar17]);
            piVar16 = col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar19 = col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)((long)piVar19 - (long)piVar16 >> 2));
      }
      if ((local_4aa != 0) &&
         (row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start)) {
        uVar17 = 0;
        local_410 = (HighsTimer *)((ulong)local_410 & 0xffffffff00000000);
        piVar16 = row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar19 = row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(all_continuous.
                                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,piVar16[uVar17]);
          dVar3 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar23 + uVar17];
          if ((dVar3 == 0.0) && (!NAN(dVar3))) {
            local_410 = (HighsTimer *)CONCAT44(local_410._4_4_,(int)local_410 + 1);
            __position._M_current =
                 (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)infeasible_row_subset,__position,
                         (int *)&all_continuous);
              piVar16 = row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar19 = row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            else {
              *__position._M_current = piVar16[uVar17];
              (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)((long)piVar19 - (long)piVar16 >> 2));
      }
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Elasticity filter after %d passes enforces bounds on %d cols and %d rows\n",
                   uVar15,(ulong)uVar24,(ulong)local_410 & 0xffffffff);
      std::vector<double,_std::allocator<double>_>::vector(&local_d8,&original_col_upper);
      uVar17 = (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar17 == 0) {
        pHVar14 = (pointer)0x0;
        sVar29 = 0;
      }
      else {
        if ((long)uVar17 < 0) {
          std::__throw_bad_alloc();
        }
        pHVar14 = (pointer)operator_new(uVar17);
        sVar29 = (long)original_integrality.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)original_integrality.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_f0.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pHVar14 + uVar17;
      local_f0.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start = pHVar14;
      if (original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        memmove(pHVar14,original_integrality.
                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                        super__Vector_impl_data._M_start,sVar29);
      }
      local_f0.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish = pHVar14 + sVar29;
      elasticityFilterReturn
                (this,kOk,iVar31 == 0,original_num_col,local_480,&original_col_cost,
                 &original_col_lower,&local_d8,&local_f0);
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pHVar14 != (pointer)0x0) {
        operator_delete(pHVar14);
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector(&local_78,&original_col_upper);
      uVar17 = (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar17 == 0) {
        pHVar14 = (pointer)0x0;
        sVar29 = 0;
      }
      else {
        if ((long)uVar17 < 0) {
          std::__throw_bad_alloc();
        }
        pHVar14 = (pointer)operator_new(uVar17);
        sVar29 = (long)original_integrality.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)original_integrality.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_90.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pHVar14 + uVar17;
      local_90.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start = pHVar14;
      if (original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        memmove(pHVar14,original_integrality.
                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                        super__Vector_impl_data._M_start,sVar29);
      }
      local_90.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish = pHVar14 + sVar29;
      elasticityFilterReturn
                (this,kOk,false,original_num_col,local_480,&original_col_cost,&original_col_lower,
                 &local_78,&local_90);
      if (pHVar14 != (pointer)0x0) {
        operator_delete(pHVar14);
      }
    }
    return_status = kOk;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector(&local_48,&original_col_upper);
    uVar17 = (long)original_integrality.
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)original_integrality.
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar17 == 0) {
      pHVar14 = (pointer)0x0;
      sVar29 = 0;
    }
    else {
      if ((long)uVar17 < 0) {
        std::__throw_bad_alloc();
      }
      pHVar14 = (pointer)operator_new(uVar17);
      sVar29 = (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_60.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pHVar14 + uVar17;
    local_60.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = pHVar14;
    if (original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
        .super__Vector_impl_data._M_start) {
      memmove(pHVar14,original_integrality.
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar29);
    }
    local_60.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish = pHVar14 + sVar29;
    elasticityFilterReturn
              (this,return_status,false,original_num_col,local_480,&original_col_cost,
               &original_col_lower,&local_48,&local_60);
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (pHVar14 != (pointer)0x0) {
      operator_delete(pHVar14);
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
  }
LAB_00232eeb:
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(original_integrality.
                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (original_col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(original_col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (original_col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(original_col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (original_col_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(original_col_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&erow_name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ecol_name);
  if (erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return return_status;
}

Assistant:

HighsStatus Highs::elasticityFilter(
    const double global_lower_penalty, const double global_upper_penalty,
    const double global_rhs_penalty, const double* local_lower_penalty,
    const double* local_upper_penalty, const double* local_rhs_penalty,
    const bool get_infeasible_row,
    std::vector<HighsInt>& infeasible_row_subset) {
  //  this->writeModel("infeasible.mps");
  // Solve the feasibility relaxation problem for the given penalties,
  // continuing to act as the elasticity filter get_infeasible_row is
  // true, resulting in an infeasibility subset for further refinement
  // as an IIS
  //
  // Construct the e-LP:
  //
  // Constraints L <= Ax <= U; l <= x <= u
  //
  // Transformed to
  //
  // L <= Ax + e_L - e_U <= U,
  //
  // l <=  x + e_l - e_u <= u,
  //
  // where the elastic variables are not used if the corresponding
  // bound is infinite or the local/global penalty is negative.
  //
  // x is free, and the objective is the linear function of the
  // elastic variables given by the local/global penalties
  //
  // col_of_ecol lists the column indices corresponding to the entries in
  // bound_of_col_of_ecol so that the results can be interpreted
  //
  // row_of_ecol lists the row indices corresponding to the entries in
  // bound_of_row_of_ecol so that the results can be interpreted
  std::vector<HighsInt> col_of_ecol;
  std::vector<HighsInt> row_of_ecol;
  std::vector<double> bound_of_row_of_ecol;
  std::vector<double> bound_of_col_of_ecol;
  std::vector<double> erow_lower;
  std::vector<double> erow_upper;
  std::vector<HighsInt> erow_start;
  std::vector<HighsInt> erow_index;
  std::vector<double> erow_value;
  // Accumulate names for ecols and erows, re-using ecol_name for the
  // names of row ecols after defining the names of col ecols
  std::vector<std::string> ecol_name;
  std::vector<std::string> erow_name;
  std::vector<double> ecol_cost;
  std::vector<double> ecol_lower;
  std::vector<double> ecol_upper;
  const HighsLp& lp = this->model_.lp_;
  HighsInt evar_ix = lp.num_col_;
  HighsStatus run_status;
  const bool write_model = false;
  // Take copies of the original model dimensions and column data
  // vectors, as they will be modified in forming the e-LP
  const HighsInt original_num_col = lp.num_col_;
  const HighsInt original_num_row = lp.num_row_;
  const std::vector<double> original_col_cost = lp.col_cost_;
  const std::vector<double> original_col_lower = lp.col_lower_;
  const std::vector<double> original_col_upper = lp.col_upper_;
  const std::vector<HighsVarType> original_integrality = lp.integrality_;
  // Zero the column costs
  std::vector<double> zero_costs;
  zero_costs.assign(original_num_col, 0);
  run_status = this->changeColsCost(0, lp.num_col_ - 1, zero_costs.data());
  assert(run_status == HighsStatus::kOk);

  if (get_infeasible_row && lp.integrality_.size()) {
    // Set any integrality to continuous
    std::vector<HighsVarType> all_continuous;
    all_continuous.assign(original_num_col, HighsVarType::kContinuous);
    run_status =
        this->changeColsIntegrality(0, lp.num_col_ - 1, all_continuous.data());
    assert(run_status == HighsStatus::kOk);
  }

  // For the columns
  const bool has_local_lower_penalty = local_lower_penalty;
  const bool has_global_elastic_lower = global_lower_penalty >= 0;
  const bool has_elastic_lower =
      has_local_lower_penalty || has_global_elastic_lower;
  const bool has_local_upper_penalty = local_upper_penalty;
  const bool has_global_elastic_upper = global_upper_penalty >= 0;
  const bool has_elastic_upper =
      has_local_upper_penalty || has_global_elastic_upper;
  const bool has_elastic_columns = has_elastic_lower || has_elastic_upper;
  // For the rows
  const bool has_local_rhs_penalty = local_rhs_penalty;
  const bool has_global_elastic_rhs = global_rhs_penalty >= 0;
  const bool has_elastic_rows = has_local_rhs_penalty || has_global_elastic_rhs;
  assert(has_elastic_columns || has_elastic_rows);

  const HighsInt col_ecol_offset = lp.num_col_;
  if (has_elastic_columns) {
    // Accumulate bounds to be used for columns
    std::vector<double> col_lower;
    std::vector<double> col_upper;
    // When defining names, need to know the column number
    const bool has_col_names = lp.col_names_.size() > 0;
    erow_start.push_back(0);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      const double lower = lp.col_lower_[iCol];
      const double upper = lp.col_upper_[iCol];
      // Original bounds used unless e-variable introduced
      col_lower.push_back(lower);
      col_upper.push_back(upper);
      // Free columns have no erow
      if (lower <= -kHighsInf && upper >= kHighsInf) continue;

      // Get the penalty for violating the lower bounds on this column
      const double lower_penalty = has_local_lower_penalty
                                       ? local_lower_penalty[iCol]
                                       : global_lower_penalty;
      // Negative lower penalty and infinite upper bound implies that the
      // bounds cannot be violated
      if (lower_penalty < 0 && upper >= kHighsInf) continue;

      // Get the penalty for violating the upper bounds on this column
      const double upper_penalty = has_local_upper_penalty
                                       ? local_upper_penalty[iCol]
                                       : global_upper_penalty;
      // Infinite upper bound and negative lower penalty implies that the
      // bounds cannot be violated
      if (lower <= -kHighsInf && upper_penalty < 0) continue;
      erow_lower.push_back(lower);
      erow_upper.push_back(upper);
      if (has_col_names)
        erow_name.push_back("row_" + std::to_string(iCol) + "_" +
                            lp.col_names_[iCol] + "_erow");
      // Define the entry for x[iCol]
      erow_index.push_back(iCol);
      erow_value.push_back(1);
      if (lower > -kHighsInf && lower_penalty >= 0) {
        // New e_l variable
        col_of_ecol.push_back(iCol);
        if (has_col_names)
          ecol_name.push_back("col_" + std::to_string(iCol) + "_" +
                              lp.col_names_[iCol] + "_lower");
        // Save the original lower bound on this column and free its
        // lower bound
        bound_of_col_of_ecol.push_back(lower);
        col_lower[iCol] = -kHighsInf;
        erow_index.push_back(evar_ix);
        erow_value.push_back(1);
        ecol_cost.push_back(lower_penalty);
        evar_ix++;
      }
      if (upper < kHighsInf && upper_penalty >= 0) {
        // New e_u variable
        col_of_ecol.push_back(iCol);
        if (has_col_names)
          ecol_name.push_back("col_" + std::to_string(iCol) + "_" +
                              lp.col_names_[iCol] + "_upper");
        // Save the original upper bound on this column and free its
        // upper bound
        bound_of_col_of_ecol.push_back(upper);
        col_upper[iCol] = kHighsInf;
        erow_index.push_back(evar_ix);
        erow_value.push_back(-1);
        ecol_cost.push_back(upper_penalty);
        evar_ix++;
      }
      erow_start.push_back(erow_index.size());
      HighsInt row_nz =
          erow_start[erow_start.size() - 1] - erow_start[erow_start.size() - 2];
      //      printf("eRow for column %d has %d nonzeros\n", int(iCol),
      //      int(row_nz));
      assert(row_nz == 2 || row_nz == 3);
    }
    HighsInt num_new_col = col_of_ecol.size();
    HighsInt num_new_row = erow_start.size() - 1;
    HighsInt num_new_nz = erow_start[num_new_row];
    if (kIisDevReport)
      printf(
          "Elasticity filter: For columns there are %d variables and %d "
          "constraints\n",
          int(num_new_col), int(num_new_row));
    // Apply the original column bound changes
    assert(col_lower.size() == static_cast<size_t>(lp.num_col_));
    assert(col_upper.size() == static_cast<size_t>(lp.num_col_));
    run_status = this->changeColsBounds(0, lp.num_col_ - 1, col_lower.data(),
                                        col_upper.data());
    assert(run_status == HighsStatus::kOk);
    // Add the new columns
    ecol_lower.assign(num_new_col, 0);
    ecol_upper.assign(num_new_col, kHighsInf);
    run_status = this->addCols(num_new_col, ecol_cost.data(), ecol_lower.data(),
                               ecol_upper.data(), 0, nullptr, nullptr, nullptr);
    assert(run_status == HighsStatus::kOk);
    // Add the new rows
    assert(erow_start.size() == static_cast<size_t>(num_new_row + 1));
    assert(erow_index.size() == static_cast<size_t>(num_new_nz));
    assert(erow_value.size() == static_cast<size_t>(num_new_nz));
    run_status = this->addRows(num_new_row, erow_lower.data(),
                               erow_upper.data(), num_new_nz, erow_start.data(),
                               erow_index.data(), erow_value.data());
    assert(run_status == HighsStatus::kOk);
    if (has_col_names) {
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++)
        this->passColName(col_ecol_offset + iCol, ecol_name[iCol]);
      for (HighsInt iRow = 0; iRow < num_new_row; iRow++)
        this->passRowName(original_num_row + iRow, erow_name[iRow]);
    }
    assert(ecol_cost.size() == static_cast<size_t>(num_new_col));
    assert(ecol_lower.size() == static_cast<size_t>(num_new_col));
    assert(ecol_upper.size() == static_cast<size_t>(num_new_col));
    if (write_model) {
      printf("\nAfter adding %d e-rows\n=============\n", int(num_new_col));
      bool output_flag;
      run_status = this->getOptionValue("output_flag", output_flag);
      this->setOptionValue("output_flag", true);
      this->writeModel("");
      this->setOptionValue("output_flag", output_flag);
    }
  }
  const HighsInt row_ecol_offset = lp.num_col_;
  if (has_elastic_rows) {
    // Add the columns corresponding to the e_L and e_U variables for
    // the constraints
    ecol_name.clear();
    ecol_cost.clear();
    std::vector<HighsInt> ecol_start;
    std::vector<HighsInt> ecol_index;
    std::vector<double> ecol_value;
    ecol_start.push_back(0);
    const bool has_row_names = lp.row_names_.size() > 0;
    for (HighsInt iRow = 0; iRow < original_num_row; iRow++) {
      // Get the penalty for violating the bounds on this row
      const double penalty =
          has_local_rhs_penalty ? local_rhs_penalty[iRow] : global_rhs_penalty;
      // Negative penalty implies that the bounds cannot be violated
      if (penalty < 0) continue;
      const double lower = lp.row_lower_[iRow];
      const double upper = lp.row_upper_[iRow];
      if (lower > -kHighsInf) {
        // Create an e-var for the row lower bound
        row_of_ecol.push_back(iRow);
        if (has_row_names)
          ecol_name.push_back("row_" + std::to_string(iRow) + "_" +
                              lp.row_names_[iRow] + "_lower");
        bound_of_row_of_ecol.push_back(lower);
        // Define the sub-matrix column
        ecol_index.push_back(iRow);
        ecol_value.push_back(1);
        ecol_start.push_back(ecol_index.size());
        ecol_cost.push_back(penalty);
        evar_ix++;
      }
      if (upper < kHighsInf) {
        // Create an e-var for the row upper bound
        row_of_ecol.push_back(iRow);
        if (has_row_names)
          ecol_name.push_back("row_" + std::to_string(iRow) + "_" +
                              lp.row_names_[iRow] + "_upper");
        bound_of_row_of_ecol.push_back(upper);
        // Define the sub-matrix column
        ecol_index.push_back(iRow);
        ecol_value.push_back(-1);
        ecol_start.push_back(ecol_index.size());
        ecol_cost.push_back(penalty);
        evar_ix++;
      }
    }
    HighsInt num_new_col = ecol_start.size() - 1;
    HighsInt num_new_nz = ecol_start[num_new_col];
    ecol_lower.assign(num_new_col, 0);
    ecol_upper.assign(num_new_col, kHighsInf);
    assert(ecol_cost.size() == static_cast<size_t>(num_new_col));
    assert(ecol_lower.size() == static_cast<size_t>(num_new_col));
    assert(ecol_upper.size() == static_cast<size_t>(num_new_col));
    assert(ecol_start.size() == static_cast<size_t>(num_new_col + 1));
    assert(ecol_index.size() == static_cast<size_t>(num_new_nz));
    assert(ecol_value.size() == static_cast<size_t>(num_new_nz));
    run_status = this->addCols(num_new_col, ecol_cost.data(), ecol_lower.data(),
                               ecol_upper.data(), num_new_nz, ecol_start.data(),
                               ecol_index.data(), ecol_value.data());
    assert(run_status == HighsStatus::kOk);
    if (has_row_names) {
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++)
        this->passColName(row_ecol_offset + iCol, ecol_name[iCol]);
    }

    if (write_model) {
      bool output_flag;
      printf("\nAfter adding %d e-cols\n=============\n", int(num_new_col));
      run_status = this->getOptionValue("output_flag", output_flag);
      this->setOptionValue("output_flag", true);
      this->writeModel("");
      this->setOptionValue("output_flag", output_flag);
    }
  }

  if (write_model) this->writeModel("elastic.mps");

  // Lambda for gathering data when solving an LP
  auto solveLp = [&]() -> HighsStatus {
    HighsIisInfo iis_info;
    iis_info.simplex_time = -this->getRunTime();
    iis_info.simplex_iterations = -info_.simplex_iteration_count;
    run_status = this->run();
    assert(run_status == HighsStatus::kOk);
    if (run_status != HighsStatus::kOk) return run_status;
    iis_info.simplex_time += this->getRunTime();
    iis_info.simplex_iterations += info_.simplex_iteration_count;
    this->iis_.info_.push_back(iis_info);
    return run_status;
  };

  run_status = solveLp();

  if (run_status != HighsStatus::kOk)
    return elasticityFilterReturn(run_status, false, original_num_col,
                                  original_num_row, original_col_cost,
                                  original_col_lower, original_col_upper,
                                  original_integrality);
  if (kIisDevReport) this->writeSolution("", kSolutionStylePretty);
  // Model status should be optimal, unless model is unbounded
  assert(this->model_status_ == HighsModelStatus::kOptimal ||
         this->model_status_ == HighsModelStatus::kUnbounded);

  if (!get_infeasible_row)
    return elasticityFilterReturn(HighsStatus::kOk, false, original_num_col,
                                  original_num_row, original_col_cost,
                                  original_col_lower, original_col_upper,
                                  original_integrality);
  const HighsSolution& solution = this->getSolution();
  // Now fix e-variables that are positive and re-solve until e-LP is infeasible
  HighsInt loop_k = 0;
  bool feasible_model = false;
  for (;;) {
    if (kIisDevReport)
      printf("\nElasticity filter pass %d\n==============\n", int(loop_k));
    HighsInt num_fixed = 0;
    if (has_elastic_columns) {
      for (size_t eCol = 0; eCol < col_of_ecol.size(); eCol++) {
        HighsInt iCol = col_of_ecol[eCol];
        if (solution.col_value[col_ecol_offset + eCol] >
            this->options_.primal_feasibility_tolerance) {
          if (kIisDevReport)
            printf(
                "E-col %2d (column %2d) corresponds to column %2d with bound "
                "%g "
                "and has solution value %g\n",
                int(eCol), int(col_ecol_offset + eCol), int(iCol),
                bound_of_col_of_ecol[eCol],
                solution.col_value[col_ecol_offset + eCol]);
          this->changeColBounds(col_ecol_offset + eCol, 0, 0);
          num_fixed++;
        }
      }
    }
    if (has_elastic_rows) {
      for (size_t eCol = 0; eCol < row_of_ecol.size(); eCol++) {
        HighsInt iRow = row_of_ecol[eCol];
        if (solution.col_value[row_ecol_offset + eCol] >
            this->options_.primal_feasibility_tolerance) {
          if (kIisDevReport)
            printf(
                "E-row %2d (column %2d) corresponds to    row %2d with bound "
                "%g "
                "and has solution value %g\n",
                int(eCol), int(row_ecol_offset + eCol), int(iRow),
                bound_of_row_of_ecol[eCol],
                solution.col_value[row_ecol_offset + eCol]);
          this->changeColBounds(row_ecol_offset + eCol, 0, 0);
          num_fixed++;
        }
      }
    }
    if (num_fixed == 0) {
      // No elastic variables were positive, so problem is feasible
      feasible_model = true;
      break;
    }
    HighsStatus run_status = solveLp();
    if (run_status != HighsStatus::kOk)
      return elasticityFilterReturn(run_status, feasible_model,
                                    original_num_col, original_num_row,
                                    original_col_cost, original_col_lower,
                                    original_col_upper, original_integrality);
    if (kIisDevReport) this->writeSolution("", kSolutionStylePretty);
    HighsModelStatus model_status = this->getModelStatus();
    if (model_status == HighsModelStatus::kInfeasible) break;
    loop_k++;
  }

  infeasible_row_subset.clear();
  HighsInt num_enforced_col_ecol = 0;
  HighsInt num_enforced_row_ecol = 0;
  if (has_elastic_columns) {
    for (size_t eCol = 0; eCol < col_of_ecol.size(); eCol++) {
      HighsInt iCol = col_of_ecol[eCol];
      if (lp.col_upper_[col_ecol_offset + eCol] == 0) {
        num_enforced_col_ecol++;
        printf(
            "Col e-col %2d (column %2d) corresponds to column %2d with bound "
            "%g "
            "and is enforced\n",
            int(eCol), int(col_ecol_offset + eCol), int(iCol),
            bound_of_col_of_ecol[eCol]);
      }
    }
  }
  if (has_elastic_rows) {
    for (size_t eCol = 0; eCol < row_of_ecol.size(); eCol++) {
      HighsInt iRow = row_of_ecol[eCol];
      if (lp.col_upper_[row_ecol_offset + eCol] == 0) {
        num_enforced_row_ecol++;
        infeasible_row_subset.push_back(iRow);
        if (kIisDevReport)
          printf(
              "Row e-col %2d (column %2d) corresponds to    row %2d with bound "
              "%g and is enforced\n",
              int(eCol), int(row_ecol_offset + eCol), int(iRow),
              bound_of_row_of_ecol[eCol]);
      }
    }
  }
  if (feasible_model)
    assert(num_enforced_col_ecol == 0 && num_enforced_row_ecol == 0);

  highsLogUser(
      options_.log_options, HighsLogType::kInfo,
      "Elasticity filter after %d passes enforces bounds on %d cols and %d "
      "rows\n",
      int(loop_k), int(num_enforced_col_ecol), int(num_enforced_row_ecol));

  if (kIisDevReport)
    printf(
        "\nElasticity filter after %d passes enforces bounds on %d cols and %d "
        "rows\n",
        int(loop_k), int(num_enforced_col_ecol), int(num_enforced_row_ecol));

  return elasticityFilterReturn(HighsStatus::kOk, feasible_model,
                                original_num_col, original_num_row,
                                original_col_cost, original_col_lower,
                                original_col_upper, original_integrality);
}